

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_file_reader_teardown_close(mpack_reader_t *reader)

{
  int iVar1;
  
  if ((FILE *)reader->context != (FILE *)0x0) {
    iVar1 = fclose((FILE *)reader->context);
    if (iVar1 != 0) {
      mpack_reader_flag_error(reader,mpack_error_io);
    }
  }
  mpack_file_reader_teardown(reader);
  return;
}

Assistant:

static void mpack_file_reader_teardown_close(mpack_reader_t* reader) {
    FILE* file = (FILE*)reader->context;

    if (file) {
        int ret = fclose(file);
        if (ret != 0)
            mpack_reader_flag_error(reader, mpack_error_io);
    }

    mpack_file_reader_teardown(reader);
}